

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O3

bool __thiscall Spi::writeBin(Spi *this,string *filename)

{
  byte bVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  FILE *__s;
  size_t sVar4;
  int *piVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  bool bVar9;
  uint8_t buffer_1 [256];
  timespec local_138 [16];
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    writeBin((Spi *)filename);
  }
  else {
    iVar2 = fseek(__stream,0,2);
    if (iVar2 == -1) {
      __s = tmpfile();
      if (__s != (FILE *)0x0) {
        sVar6 = fread(writeBin::buffer,1,0x1000,__stream);
        if (sVar6 == 0) {
          lVar3 = 0;
        }
        else {
          lVar3 = 0;
          do {
            sVar4 = fwrite(writeBin::buffer,1,sVar6,__s);
            if (sVar4 != sVar6) {
              writeBin();
              return false;
            }
            lVar3 = lVar3 + sVar6;
            sVar6 = fread(writeBin::buffer,1,0x1000,__stream);
          } while (sVar6 != 0);
        }
        fclose(__stream);
        fseek(__s,0,0);
LAB_001155b5:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Resetting...",0xc)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        set_gpio(this,1,0);
        local_138[0].tv_sec = 0;
        local_138[0].tv_nsec = 250000000;
        do {
          iVar2 = nanosleep(local_138,local_138);
          if (iVar2 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cdone: ",7);
        send_byte(this,0x81);
        bVar1 = recv_byte(this);
        bVar9 = (bVar1 & 0x40) != 0;
        pcVar7 = "high";
        if (!bVar9) {
          pcVar7 = "low";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pcVar7,(ulong)bVar9 + 3);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        flash_reset(this);
        flash_power_up(this);
        flash_read_id(this);
        uVar8 = (int)lVar3 + 0xffffU & 0xffff0000;
        if (0 < (int)uVar8) {
          iVar2 = 0;
          do {
            flash_write_enable(this);
            flash_64kB_sector_erase(this,iVar2);
            if (this->verbose == true) {
              writeBin(this);
            }
            flash_wait(this);
            iVar2 = iVar2 + 0x10000;
          } while (iVar2 < (int)uVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Programming... ",0xf);
        sVar6 = fread(local_138,1,0x100,__s);
        if (0 < (int)sVar6) {
          uVar8 = 0;
          do {
            flash_write_enable(this);
            flash_prog(this,uVar8,(uint8_t *)local_138,(int)sVar6);
            flash_wait(this);
            uVar8 = uVar8 + (int)sVar6;
            sVar6 = fread(local_138,1,(ulong)(0x100 - (uVar8 & 0xff)),__s);
          } while (0 < (int)sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done.",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        fseek(__s,0,0);
        flash_power_down(this);
        set_gpio(this,1,1);
        local_138[0].tv_sec = 0;
        local_138[0].tv_nsec = 250000000;
        do {
          iVar2 = nanosleep(local_138,local_138);
          if (iVar2 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cdone: ",7);
        send_byte(this,0x81);
        bVar1 = recv_byte(this);
        bVar9 = (bVar1 & 0x40) != 0;
        pcVar7 = "high";
        if (!bVar9) {
          pcVar7 = "low";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pcVar7,(ulong)bVar9 + 3);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done.",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        if (__s != _stdin) {
          if (__s != _stdout) {
            fclose(__s);
            return true;
          }
          return true;
        }
        return true;
      }
      writeBin();
    }
    else {
      lVar3 = ftell(__stream);
      if (lVar3 == -1) {
        writeBin((Spi *)filename);
      }
      else {
        iVar2 = fseek(__stream,0,0);
        __s = __stream;
        if (iVar2 != -1) goto LAB_001155b5;
        writeBin((Spi *)filename);
      }
    }
  }
  return false;
}

Assistant:

bool Spi::writeBin(string filename) {
	int rw_offset = 0;

	FILE *f = NULL;
	long file_size = -1;

	f = fopen(filename.c_str(), "rb");

	if (f == NULL) {
		fprintf(stderr, "Can't open '%s' for reading: ", filename.c_str());
		return false;
	}

	if (fseek(f, 0L, SEEK_END) != -1) {
		file_size = ftell(f);
		if (file_size == -1) {
			fprintf(stderr, "%s: ftell: ", filename.c_str());
			return false;
		}
		if (fseek(f, 0L, SEEK_SET) == -1) {
			fprintf(stderr, "%s: fseek: ", filename.c_str());
			return false;
		}
	} else {
		FILE *pipe = f;

		f = tmpfile();
		if (f == NULL) {
			fprintf(stderr, "can't open temporary file\n");
			return false;
		}
		file_size = 0;

		while (true) {
			static unsigned char buffer[4096];
			size_t rc = fread(buffer, 1, 4096, pipe);
			if (rc <= 0)
				break;
			size_t wc = fwrite(buffer, 1, rc, f);
			if (wc != rc) {
				fprintf(stderr, "can't write to temporary file\n");
				return false;
			}
			file_size += rc;
		}
		fclose(pipe);

		/* now seek to the beginning so we can
		 start reading again */
		fseek(f, 0, SEEK_SET);
	}

	cout << "Resetting..." << endl;

	flash_chip_deselect();
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	cout << "cdone: " << (get_cdone() ? "high" : "low") << endl;

	flash_reset();
	flash_power_up();

	flash_read_id();

	int begin_addr = rw_offset & ~0xffff;
	int end_addr = (rw_offset + file_size + 0xffff) & ~0xffff;

	for (int addr = begin_addr; addr < end_addr; addr += 0x10000) {
		flash_write_enable();
		flash_64kB_sector_erase(addr);
		if (verbose) {
			fprintf(stderr, "Status after block erase:\n");
			flash_read_status();
		}
		flash_wait();
	}

	cout << "Programming... ";

	for (int rc, addr = 0; true; addr += rc) {
		uint8_t buffer[256];
		int page_size = 256 - (rw_offset + addr) % 256;
		rc = fread(buffer, 1, page_size, f);
		if (rc <= 0)
			break;
		flash_write_enable();
		flash_prog(rw_offset + addr, buffer, rc);
		flash_wait();
	}

	cout << "Done." << endl;

	/* seek to the beginning for second pass */
	fseek(f, 0, SEEK_SET);

	// ---------------------------------------------------------
	// Reset
	// ---------------------------------------------------------

	flash_power_down();

	set_gpio(1, 1);
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	cout << "cdone: " << (get_cdone() ? "high" : "low") << endl;
	cout << "Done." << endl;

	if (f != NULL && f != stdin && f != stdout)
		fclose(f);
	return true;
}